

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::LE_Fire_PDU::Encode(LE_Fire_PDU *this,KDataStream *stream)

{
  LE_EntityIdentifier *pLVar1;
  MunitionDescriptor *this_00;
  byte bVar2;
  KUINT16 KVar3;
  WarheadType WVar4;
  FuseType FVar5;
  EntityType *pEVar6;
  
  checkFlagsAndPDULength(this);
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::Write(stream,(this->m_FireFlagUnion).m_ui8Flag);
  bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  if ((bVar2 & 1) != 0) {
    (*(this->m_TargetID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_TargetID,stream);
    bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 4) != 0) {
    pLVar1 = &this->m_MunitionID;
    if ((bVar2 & 2) == 0) {
      KVar3 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(pLVar1);
      KDataStream::Write<unsigned_short>(stream,KVar3);
    }
    else {
      (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar1,stream);
    }
  }
  pLVar1 = &this->m_EventID;
  if (((this->m_FireFlagUnion).m_ui8Flag & 8) == 0) {
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(pLVar1);
    KDataStream::Write<unsigned_short>(stream,KVar3);
  }
  else {
    (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar1,stream);
  }
  if (((this->m_FireFlagUnion).m_ui8Flag & 0x40) != 0) {
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  }
  this_00 = &this->m_MunitionDesc;
  pEVar6 = DATA_TYPE::Descriptor::GetType(&this_00->super_Descriptor);
  (*(pEVar6->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar6,stream);
  bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  if ((bVar2 & 0x10) != 0) {
    WVar4 = DATA_TYPE::MunitionDescriptor::GetWarhead(this_00);
    KDataStream::Write<unsigned_short>(stream,(unsigned_short)WVar4);
    FVar5 = DATA_TYPE::MunitionDescriptor::GetFuse(this_00);
    KDataStream::Write<unsigned_short>(stream,(unsigned_short)FVar5);
    bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x20) != 0) {
    KVar3 = DATA_TYPE::MunitionDescriptor::GetQuantity(this_00);
    KDataStream::Write<unsigned_short>(stream,KVar3);
    KVar3 = DATA_TYPE::MunitionDescriptor::GetRate(this_00);
    KDataStream::Write<unsigned_short>(stream,KVar3);
  }
  (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Vel,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Range);
  KVar3 = KDataStream::GetBufferSize(stream);
  if (KVar3 == (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) {
    return;
  }
  __assert_fail("stream.GetBufferSize() == m_ui16PDULength",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jarvisfriends[P]KDIS/KDIS/PDU/Live_Entity/LE_Fire_PDU.cpp"
                ,0x2b2,"virtual void KDIS::PDU::LE_Fire_PDU::Encode(KDataStream &) const");
}

Assistant:

void LE_Fire_PDU::Encode( KDataStream & stream ) const
{
    // We need to cast away the const so we can check the flag values are correct
    // Must check the flags before encoding the header since PDU length may change
    LE_Fire_PDU * self = const_cast<LE_Fire_PDU*>( this );
    self->checkFlagsAndPDULength();

    LE_Header::Encode( stream );

    stream << m_FireFlagUnion.m_ui8Flag;

    // F0: Target Entity ID
    if( m_FireFlagUnion.m_ui8TargetId )
    {
        stream << KDIS_STREAM m_TargetID;
    }

    // F2: Munition ID
    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_FireFlagUnion.m_ui8MunitionSiteApp )
        {
            stream << KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_MunitionID.GetEntityID();
        }
    }

    // F3: Event ID
    if( m_FireFlagUnion.m_ui8EventSiteAppId )
    {
        stream << KDIS_STREAM m_EventID;
    }
    else
    {
        // We cant use the standard encode/decode functions here as not all fields are included.
        stream << m_EventID.GetEntityID();
    }

    // F6: Location
    if( m_FireFlagUnion.m_ui8Location )
    {
        stream << KDIS_STREAM m_Loc;
    }

    // Munition
    stream << KDIS_STREAM m_MunitionDesc.GetType();
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8WarheadFuse )
    {
        stream << ( KUINT16 )m_MunitionDesc.GetWarhead()
               << ( KUINT16 )m_MunitionDesc.GetFuse();
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8QuantRate )
    {
        stream << m_MunitionDesc.GetQuantity()
               << m_MunitionDesc.GetRate();
    }

    // Velocity and Range
    stream << KDIS_STREAM m_Vel
           << m_ui16Range;

    assert(stream.GetBufferSize() == m_ui16PDULength);
}